

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O1

int Abc_NodeRefDerefStop(Abc_Obj_t *pNode,int fReference)

{
  uint uVar1;
  int *piVar2;
  void **ppvVar3;
  Abc_Obj_t *pNode_00;
  Abc_Obj_t *pAVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar7 = 0;
  while( true ) {
    uVar1 = *(uint *)&pNode->field_0x14;
    if (((uVar1 & 0xf) == 2) || ((uVar1 & 0xf) == 5)) break;
    piVar2 = (pNode->vFanins).pArray;
    ppvVar3 = pNode->pNtk->vObjs->pArray;
    pNode_00 = (Abc_Obj_t *)ppvVar3[*piVar2];
    pAVar4 = (Abc_Obj_t *)ppvVar3[piVar2[1]];
    if (fReference == 0) {
      iVar6 = (pNode_00->vFanouts).nSize;
      if (iVar6 < 1) {
        __assert_fail("pNode0->vFanouts.nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                      ,0xbf,"int Abc_NodeRefDerefStop(Abc_Obj_t *, int)");
      }
      if ((pAVar4->vFanouts).nSize < 1) {
        __assert_fail("pNode1->vFanouts.nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcRefs.c"
                      ,0xc0,"int Abc_NodeRefDerefStop(Abc_Obj_t *, int)");
      }
      iVar5 = 1;
      if (((uVar1 >> 10 & 1) == 0) &&
         (iVar6 = iVar6 + -1, (pNode_00->vFanouts).nSize = iVar6, iVar6 == 0)) {
        iVar5 = Abc_NodeRefDerefStop(pNode_00,0);
        iVar5 = iVar5 + 1;
      }
      if ((pNode->field_0x15 & 8) != 0) goto LAB_0081e1d3;
      fReference = 0;
      piVar2 = &(pAVar4->vFanouts).nSize;
      *piVar2 = *piVar2 + -1;
      iVar6 = *piVar2;
    }
    else {
      iVar5 = 1;
      if (((uVar1 >> 10 & 1) == 0) &&
         (iVar6 = (pNode_00->vFanouts).nSize, (pNode_00->vFanouts).nSize = iVar6 + 1, iVar6 == 0)) {
        iVar5 = Abc_NodeRefDerefStop(pNode_00,1);
        iVar5 = iVar5 + 1;
      }
      if ((pNode->field_0x15 & 8) != 0) goto LAB_0081e1d3;
      iVar6 = (pAVar4->vFanouts).nSize;
      (pAVar4->vFanouts).nSize = iVar6 + 1;
      fReference = 1;
    }
    if (iVar6 != 0) goto LAB_0081e1d3;
    iVar7 = iVar7 + iVar5;
    pNode = pAVar4;
  }
  iVar5 = 0;
LAB_0081e1d3:
  return iVar7 + iVar5;
}

Assistant:

int Abc_NodeRefDerefStop( Abc_Obj_t * pNode, int fReference )
{
    Abc_Obj_t * pNode0, * pNode1;
    int Counter;
    // skip the CI
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    // process the internal node
    pNode0 = Abc_ObjFanin0(pNode);
    pNode1 = Abc_ObjFanin1(pNode);
    Counter = 1;
    if ( fReference )
    {
        if ( !Abc_ObjFaninC0(pNode) && pNode0->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDerefStop( pNode0, fReference );
        if ( !Abc_ObjFaninC1(pNode) && pNode1->vFanouts.nSize++ == 0 )
            Counter += Abc_NodeRefDerefStop( pNode1, fReference );
    }
    else
    {
        assert( pNode0->vFanouts.nSize > 0 );
        assert( pNode1->vFanouts.nSize > 0 );
        if ( !Abc_ObjFaninC0(pNode) && --pNode0->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDerefStop( pNode0, fReference );
        if ( !Abc_ObjFaninC1(pNode) && --pNode1->vFanouts.nSize == 0 )
            Counter += Abc_NodeRefDerefStop( pNode1, fReference );
    }
    return Counter;
}